

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionType.cpp
# Opt level: O2

void __thiscall hdc::FunctionType::FunctionType(FunctionType *this)

{
  Type::Type(&this->super_Type);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_0019ac40;
  (this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ASTNode::setKind((ASTNode *)this,AST_FUNCTION_TYPE);
  return;
}

Assistant:

FunctionType::FunctionType() {
    setKind(AST_FUNCTION_TYPE);
}